

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall llvm::AppleAcceleratorTable::Entry::Entry(Entry *this,HeaderData *HdrData)

{
  SmallVector<llvm::DWARFFormValue,_3U> *this_00;
  SmallVectorImpl<llvm::DWARFFormValue> *pSVar1;
  pair<unsigned_short,_llvm::dwarf::Form> *Atom;
  void *pvVar2;
  long lVar3;
  DWARFFormValue local_68;
  Entry *local_38;
  
  this_00 = &(this->super_Entry).Values;
  (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
       &(this->super_Entry).Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
  pSVar1 = &(this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>;
  (pSVar1->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
  (this->super_Entry)._vptr_Entry = (_func_int **)&PTR_getCUOffset_01127b90;
  this->HdrData = HdrData;
  local_38 = this;
  SmallVectorImpl<llvm::DWARFFormValue>::reserve
            (&this_00->super_SmallVectorImpl<llvm::DWARFFormValue>,
             (ulong)(HdrData->Atoms).
                    super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                    super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                    .
                    super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                    .super_SmallVectorBase.Size);
  pvVar2 = (HdrData->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
           super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
           super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
           super_SmallVectorBase.BeginX;
  for (lVar3 = (ulong)(HdrData->Atoms).
                      super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                      super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                      .
                      super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                      .super_SmallVectorBase.Size << 2; lVar3 != 0; lVar3 = lVar3 + -4) {
    local_68.Form = *(Form *)((long)pvVar2 + 2);
    local_68.Value.field_0.uval = 0;
    local_68.Value.data = (uint8_t *)0x0;
    local_68.U = (DWARFUnit *)0x0;
    local_68.C = (DWARFContext *)0x0;
    SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::push_back
              ((SmallVectorTemplateBase<llvm::DWARFFormValue,_true> *)this_00,&local_68);
    pvVar2 = (void *)((long)pvVar2 + 4);
  }
  return;
}

Assistant:

AppleAcceleratorTable::Entry::Entry(
    const AppleAcceleratorTable::HeaderData &HdrData)
    : HdrData(&HdrData) {
  Values.reserve(HdrData.Atoms.size());
  for (const auto &Atom : HdrData.Atoms)
    Values.push_back(DWARFFormValue(Atom.second));
}